

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O0

Float pbrt::RadicalInverse(int baseIndex,uint64_t a)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  ulong in_RSI;
  int in_EDI;
  undefined1 auVar3 [64];
  uint64_t digit;
  uint64_t next;
  Float invBaseN;
  uint64_t reversedDigits;
  Float invBase;
  int base;
  float local_3c;
  long local_38;
  ulong local_30;
  float local_24;
  long local_20;
  float local_18;
  int local_14;
  ulong local_10;
  
  local_14 = *(int *)(Primes + (long)in_EDI * 4);
  local_18 = 1.0 / (float)local_14;
  local_20 = 0;
  auVar3 = ZEXT464(0x3f800000);
  local_24 = 1.0;
  local_10 = in_RSI;
  while (local_10 != 0) {
    local_30 = local_10 / (ulong)(long)local_14;
    local_38 = local_10 - local_30 * (long)local_14;
    local_20 = local_20 * local_14 + local_38;
    local_24 = local_18 * local_24;
    auVar3 = ZEXT464((uint)local_24);
    local_10 = local_30;
  }
  auVar1 = vcvtusi2ss_avx512f(auVar3._0_16_,local_20);
  local_3c = auVar1._0_4_ * local_24;
  pfVar2 = std::min<float>(&local_3c,(float *)&OneMinusEpsilon);
  return *pfVar2;
}

Assistant:

PBRT_CPU_GPU inline Float RadicalInverse(int baseIndex, uint64_t a) {
    int base = Primes[baseIndex];
    const Float invBase = (Float)1 / (Float)base;
    uint64_t reversedDigits = 0;
    Float invBaseN = 1;
    while (a) {
        uint64_t next = a / base;
        uint64_t digit = a - next * base;
        reversedDigits = reversedDigits * base + digit;
        invBaseN *= invBase;
        a = next;
    }
    return std::min(reversedDigits * invBaseN, OneMinusEpsilon);
}